

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

double interpolate_linear(double *xin,double *yin,int N,double z)

{
  size_t __size;
  double dVar1;
  double dVar2;
  int iVar3;
  double *__ptr;
  double *__ptr_00;
  int *pos;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  double local_38;
  
  __size = (long)N * 8;
  __ptr = (double *)malloc(__size);
  __ptr_00 = (double *)malloc(__size);
  pos = (int *)malloc((long)N * 4);
  sort1d_ascending(xin,N,pos);
  if (0 < N) {
    uVar5 = 0;
    do {
      iVar3 = pos[uVar5];
      __ptr[uVar5] = xin[iVar3];
      __ptr_00[uVar5] = yin[iVar3];
      uVar5 = uVar5 + 1;
    } while ((uint)N != uVar5);
  }
  if (*__ptr <= z) {
    uVar4 = N - 1;
    if (z < __ptr[(int)uVar4] || z == __ptr[(int)uVar4]) {
      uVar5 = 0;
      if (2 < N) {
        do {
          uVar6 = (int)((int)uVar5 + uVar4) / 2;
          if (__ptr[(int)uVar6] <= z) {
            uVar5 = (ulong)uVar6;
            uVar6 = uVar4;
          }
          uVar4 = uVar6;
        } while ((int)uVar5 < (int)(uVar4 - 1));
        uVar5 = (ulong)(int)uVar5;
      }
      dVar1 = __ptr[(int)uVar4];
      if ((dVar1 != z) || (NAN(dVar1) || NAN(z))) {
        dVar2 = __ptr[uVar5];
        local_38 = __ptr_00[uVar5];
        if ((dVar2 != z) || (NAN(dVar2) || NAN(z))) {
          local_38 = local_38 + ((z - dVar2) / (dVar1 - dVar2)) * (__ptr_00[(int)uVar4] - local_38);
        }
      }
      else {
        local_38 = __ptr_00[(int)uVar4];
      }
    }
    else {
      local_38 = __ptr_00[(int)uVar4];
    }
  }
  else {
    local_38 = *__ptr_00;
  }
  free(__ptr);
  free(__ptr_00);
  free(pos);
  return local_38;
}

Assistant:

double interpolate_linear(double *xin,double *yin, int N, double z) {
	int i,j,k;
	double *x,*y;
	int *pos;
	double out,ylo,yhi;

	x = (double*)malloc(sizeof(double)*N);
	y = (double*)malloc(sizeof(double)*N);
	pos = (int*)malloc(sizeof(int)*N);

	sort1d_ascending(xin,N,pos);

	for(i = 0; i < N;++i) {
		x[i] = xin[pos[i]];
		y[i] = yin[pos[i]];
	}

	ylo= y[0];
	yhi = y[N-1];

	i = 0;
	j = N - 1;

	if (z < x[0]) {
		free(x);
		free(y);
		free(pos);
		return ylo;
	}

	if (z > x[j]) {
		free(x);
		free(y);
		free(pos);
		return yhi;
	}

	while (i < j-1) {
		k = (i + j)/2;
		if (z < x[k]) {
			j = k;
		} else {
			i = k;
		}
	}

	if (z == x[j]) {
		out = y[j];
		free(x);
		free(y);
		free(pos);
		return out;
	}

	if (z == x[i]) {
		out = y[i];
		free(x);
		free(y);
		free(pos);
		return out;
	}

	out = y[i] + (y[j] - y[i])* ((z - x[i])/(x[j] - x[i]));

	free(x);
	free(y);
	free(pos);

	return out;
}